

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O1

QString * __thiscall QTextCursor::selectedText(QString *__return_storage_ptr__,QTextCursor *this)

{
  int iVar1;
  QTextCursorPrivate *pQVar2;
  QTextDocumentPrivate *pQVar3;
  int iVar4;
  int iVar5;
  QTextTable *pQVar6;
  int iVar7;
  int iVar8;
  int col;
  int iVar9;
  int iVar10;
  long in_FS_OFFSET;
  QString *text;
  int num_cols;
  int num_rows;
  int col_start;
  int row_start;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  QString local_68;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->d).d.ptr;
  if (((pQVar2 == (QTextCursorPrivate *)0x0) ||
      (pQVar3 = pQVar2->priv, pQVar3 == (QTextDocumentPrivate *)0x0)) ||
     (pQVar2->position == pQVar2->anchor)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_004c6ddc;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    local_68.d.d = (pQVar3->text).d.d;
    local_68.d.ptr = (pQVar3->text).d.ptr;
    local_68.d.size = (pQVar3->text).d.size;
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    pQVar6 = QTextCursorPrivate::complexSelectionTable((this->d).d.ptr);
    if (pQVar6 == (QTextTable *)0x0) {
      pQVar2 = (this->d).d.ptr;
      pQVar3 = pQVar2->priv;
      iVar7 = -1;
      if (pQVar3 != (QTextDocumentPrivate *)0x0 && pQVar2 != (QTextCursorPrivate *)0x0) {
        iVar7 = pQVar2->adjusted_anchor;
        if (pQVar2->position < pQVar2->adjusted_anchor) {
          iVar7 = pQVar2->position;
        }
      }
      iVar9 = -1;
      if (pQVar3 != (QTextDocumentPrivate *)0x0 && pQVar2 != (QTextCursorPrivate *)0x0) {
        iVar9 = pQVar2->adjusted_anchor;
        if (pQVar2->adjusted_anchor < pQVar2->position) {
          iVar9 = pQVar2->position;
        }
      }
      getText(__return_storage_ptr__,pQVar3,&local_68,iVar7,iVar9);
    }
    else {
      local_6c = -0x55555556;
      local_70 = -0x55555556;
      local_74 = -0x55555556;
      local_78 = -0x55555556;
      selectedTableCells(this,&local_6c,&local_74,&local_70,&local_78);
      iVar9 = local_70;
      iVar7 = local_78;
      if (0 < local_74) {
        iVar1 = local_74 + local_6c;
        iVar10 = local_78 + local_70;
        col = local_6c;
        do {
          iVar8 = iVar9;
          if (0 < iVar7) {
            do {
              local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              QTextTable::cellAt((QTextTable *)local_48,(int)pQVar6,col);
              iVar4 = QTextTableCell::rowSpan((QTextTableCell *)local_48);
              iVar5 = QTextTableCell::columnSpan((QTextTableCell *)local_48);
              if (((iVar4 == 1) ||
                  (iVar4 = QTextTableCell::row((QTextTableCell *)local_48), iVar4 == col)) &&
                 ((iVar5 == 1 ||
                  (iVar4 = QTextTableCell::column((QTextTableCell *)local_48), iVar8 == iVar4)))) {
                pQVar3 = ((this->d).d.ptr)->priv;
                iVar4 = QTextTableCell::firstPosition((QTextTableCell *)local_48);
                iVar5 = QTextTableCell::lastPosition((QTextTableCell *)local_48);
                getText(__return_storage_ptr__,pQVar3,&local_68,iVar4,iVar5);
              }
              iVar8 = iVar8 + 1;
            } while (iVar8 < iVar10);
          }
          col = col + 1;
        } while (col < iVar1);
      }
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_004c6ddc:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QTextCursor::selectedText() const
{
    if (!d || !d->priv || d->position == d->anchor)
        return QString();

    const QString docText = d->priv->buffer();
    QString text;

    QTextTable *table = d->complexSelectionTable();
    if (table) {
        int row_start, col_start, num_rows, num_cols;
        selectedTableCells(&row_start, &num_rows, &col_start, &num_cols);

        Q_ASSERT(row_start != -1);
        for (int r = row_start; r < row_start + num_rows; ++r) {
            for (int c = col_start; c < col_start + num_cols; ++c) {
                QTextTableCell cell = table->cellAt(r, c);
                int rspan = cell.rowSpan();
                int cspan = cell.columnSpan();
                if (rspan != 1) {
                    int cr = cell.row();
                    if (cr != r)
                        continue;
                }
                if (cspan != 1) {
                    int cc = cell.column();
                    if (cc != c)
                        continue;
                }

                getText(text, d->priv, docText, cell.firstPosition(), cell.lastPosition());
            }
        }
    } else {
        getText(text, d->priv, docText, selectionStart(), selectionEnd());
    }

    return text;
}